

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr CheckEvent(_Bool wait)

{
  term *t;
  infowin *piVar1;
  wchar_t wVar2;
  uint uVar3;
  uint uVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  wchar_t w;
  long lVar9;
  byte mods;
  undefined4 uVar10;
  int iVar11;
  wchar_t wVar12;
  keycode_t k;
  undefined7 in_register_00000039;
  byte bVar13;
  wchar_t h;
  KeySym ks;
  XEvent xev_body;
  char local_b8 [136];
  
  t = (term *)Term->data;
  if (((int)CONCAT71(in_register_00000039,wait) == 0) &&
     (iVar6 = XPending(metadpy_default_0), iVar6 == 0)) {
    return 1;
  }
  iVar6 = 0;
  while( true ) {
    iVar7 = XPending(metadpy_default_0);
    if (iVar7 != 0) break;
    if (iVar6 == 0) {
      idle_update();
    }
    usleep(20000);
    iVar6 = (iVar6 + 1) % 10;
  }
  XNextEvent(metadpy_default_0);
  if (xev_body.type == L'\"') {
    XRefreshKeyboardMapping(&xev_body);
    return 0;
  }
  lVar9 = 0;
  while( true ) {
    if (lVar9 == 0x840) {
      return 0;
    }
    piVar1 = *(infowin **)((long)&data[0].win + lVar9);
    if (xev_body.xany.window == piVar1->win) break;
    lVar9 = lVar9 + 0x108;
  }
  Term_activate((term *)((long)&data[0].t.user + lVar9));
  Infowin = piVar1;
  if (xev_body.type != L'\x02') {
    if (xev_body.type == L'\x16') {
      piVar1->x = xev_body.xkey.subwindow._0_2_;
      piVar1->y = xev_body.xkey.subwindow._4_2_;
      piVar1->w = xev_body.xkey.time._0_2_;
      piVar1->h = xev_body.xkey.time._4_2_;
      iVar6 = *(int *)((long)&data[0].tile_wid + lVar9);
      iVar7 = *(int *)((long)&data[0].tile_hgt + lVar9);
      wVar12 = ((int)(short)xev_body.xexpose.count._0_2_ + piVar1->ox * -2) / iVar6;
      wVar2 = ((int)(short)xev_body.xgraphicsexpose.major_code._0_2_ + piVar1->oy * -2) / iVar7;
      w = L'\x01';
      if (L'\x01' < wVar12) {
        w = wVar12;
      }
      h = L'\x01';
      if (L'\x01' < wVar2) {
        h = wVar2;
      }
      if (lVar9 == 0) {
        wVar5 = L'P';
        if (L'O' < wVar12) {
          wVar5 = w;
        }
        w = wVar5;
        wVar5 = L'\x18';
        if ((wVar2 < L'\x18') || (wVar5 = h, wVar12 < L'P')) {
          h = wVar5;
          Infowin = data[0].win;
          XResizeWindow(metadpy_default_0,(data[0].win)->win,iVar6 * w + piVar1->ox * 2,
                        iVar7 * h + piVar1->oy * 2);
        }
      }
      Term_resize(w,h);
    }
    else if (xev_body.type == L'\f') {
      iVar8 = xev_body.xfocus.mode - piVar1->ox;
      iVar6 = *(int *)((long)&data[0].tile_wid + lVar9);
      iVar7 = *(int *)((long)&data[0].tile_hgt + lVar9);
      iVar11 = xev_body.xfocus.detail - piVar1->oy;
      Term_redraw_section(iVar8 / iVar6,iVar11 / iVar7,(iVar8 + xev_body.xexpose.width) / iVar6,
                          (iVar11 + xev_body.xexpose.height) / iVar7);
    }
    else if (xev_body.type == L'\x12') {
      piVar1->field_0x23 = piVar1->field_0x23 & 0xfe;
      Term->mapped_flag = false;
    }
    else if (xev_body.type == L'\x13') {
      piVar1->field_0x23 = piVar1->field_0x23 | 1;
      Term->mapped_flag = true;
    }
    else if (xev_body.type == L'\x04') {
      uVar10 = 0;
      if (xev_body.xkey.keycode - 1 < 5) {
        uVar10 = xev_body.xkey.keycode;
      }
      Term_mousepress((xev_body.xkey.x - piVar1->ox) / *(int *)((long)Term->data + 0xe8),
                      (xev_body.xkey.y - piVar1->oy) / *(int *)((long)Term->data + 0xf0),
                      ((byte)((xev_body.xkey.state & 1) << 5) | (byte)uVar10) +
                      ((byte)xev_body.xkey.state & 4) * '\x04' +
                      ((byte)xev_body.xkey.state & 8) * '\b');
    }
    goto LAB_001257c3;
  }
  Term_activate(t);
  uVar3 = metadpy_default_4 & xev_body.xkey.state;
  uVar4 = metadpy_default_5 & xev_body.xkey.state;
  iVar6 = XLookupString(&xev_body,local_b8,0x7d,&ks,0);
  local_b8[iVar6] = '\0';
  if ((ks - 0xffe1 < 0xe) || ((ks & 0xfffffffffffffffe) == 0xff7e || ks - 0xfe01 < 0x13))
  goto LAB_001257c3;
  bVar13 = (uVar4 != 0) << 3 | (uVar3 != 0) << 2;
  switch(ks) {
  case 0xff50:
    k = 0x94;
    goto LAB_00125a1c;
  case 0xff51:
    k = 0x81;
    goto LAB_00125a1c;
  case 0xff52:
    k = 0x83;
    goto LAB_00125a1c;
  case 0xff53:
    k = 0x82;
    goto LAB_00125a1c;
  case 0xff54:
    k = 0x80;
    goto LAB_00125a1c;
  case 0xff55:
    k = 0x95;
    goto LAB_00125a1c;
  case 0xff56:
    k = 0x97;
    goto LAB_00125a1c;
  case 0xff57:
    k = 0x96;
    goto LAB_00125a1c;
  case 0xff58:
  case 0xff59:
  case 0xff5a:
  case 0xff5b:
  case 0xff5c:
  case 0xff5d:
  case 0xff5e:
  case 0xff5f:
  case 0xff60:
  case 0xff61:
  case 0xff62:
  case 0xff64:
  case 0xff65:
  case 0xff66:
  case 0xff67:
  case 0xff68:
  case 0xff69:
  case 0xff6a:
  case 0xff6c:
  case 0xff6d:
  case 0xff6e:
  case 0xff6f:
  case 0xff70:
  case 0xff71:
  case 0xff72:
  case 0xff73:
  case 0xff74:
  case 0xff75:
  case 0xff76:
  case 0xff77:
  case 0xff78:
  case 0xff79:
  case 0xff7a:
  case 0xff7b:
  case 0xff7c:
  case 0xff7d:
  case 0xff7e:
  case 0xff7f:
  case 0xff80:
  case 0xff81:
  case 0xff82:
  case 0xff83:
  case 0xff84:
  case 0xff85:
  case 0xff86:
  case 0xff87:
  case 0xff88:
  case 0xff89:
  case 0xff8a:
  case 0xff8b:
  case 0xff8c:
  case 0xff8e:
  case 0xff8f:
  case 0xff90:
  case 0xff91:
  case 0xff92:
  case 0xff93:
  case 0xff94:
  case 0xffa0:
  case 0xffa1:
  case 0xffa2:
  case 0xffa3:
  case 0xffa4:
  case 0xffa5:
  case 0xffa6:
  case 0xffa7:
  case 0xffa8:
  case 0xffa9:
  case 0xffac:
  case 0xffba:
  case 0xffbb:
  case 0xffbc:
switchD_00125760_caseD_ff58:
    if (0xfeff < (uint)ks || iVar6 == 0) goto LAB_001257c3;
    k = (keycode_t)local_b8[0];
    bVar13 = bVar13 | ((byte)(local_b8[0] - 0x20U) < 0xe1 && (xev_body.xkey.state & 4) != 0);
    mods = bVar13 | 2;
    if ((byte)(local_b8[0] - 0x3aU) < 0x27) {
      mods = bVar13;
    }
    if ((byte)(local_b8[0] - 0x21U) < 0xf) {
      mods = bVar13;
    }
    if ((byte)(local_b8[0] + 0x85U) < 4) {
      mods = bVar13;
    }
    if ((xev_body.xkey.state & 1) == 0) {
      mods = bVar13;
    }
    goto LAB_00125a35;
  case 0xff63:
    k = 0x98;
    goto LAB_00125a1c;
  case 0xff6b:
    k = 0x9a;
    goto LAB_00125a1c;
  case 0xff8d:
    k = 0x9c;
    break;
  case 0xff95:
    k = 0x94;
    break;
  case 0xff96:
    k = 0x81;
    break;
  case 0xff97:
    k = 0x83;
    break;
  case 0xff98:
    k = 0x82;
    break;
  case 0xff99:
    k = 0x80;
    break;
  case 0xff9a:
    k = 0x95;
    break;
  case 0xff9b:
    k = 0x97;
    break;
  case 0xff9c:
    k = 0x96;
    break;
  case 0xff9d:
    k = 0x9b;
    break;
  case 0xff9e:
    k = 0x98;
    break;
  case 0xff9f:
    k = 0x9e;
    break;
  case 0xffaa:
    k = 0x2a;
    break;
  case 0xffab:
    k = 0x2b;
    break;
  case 0xffad:
    k = 0x2d;
    break;
  case 0xffae:
    k = 0x2e;
    break;
  case 0xffaf:
    k = 0x2f;
    break;
  case 0xffb0:
    k = 0x30;
    break;
  case 0xffb1:
    k = 0x31;
    break;
  case 0xffb2:
    k = 0x32;
    break;
  case 0xffb3:
    k = 0x33;
    break;
  case 0xffb4:
    k = 0x34;
    break;
  case 0xffb5:
    k = 0x35;
    break;
  case 0xffb6:
    k = 0x36;
    break;
  case 0xffb7:
    k = 0x37;
    break;
  case 0xffb8:
    k = 0x38;
    break;
  case 0xffb9:
    k = 0x39;
    break;
  case 0xffbd:
    k = 0x3d;
    break;
  case 0xffbe:
    k = 0x84;
    goto LAB_00125a1c;
  case 0xffbf:
    k = 0x85;
    goto LAB_00125a1c;
  case 0xffc0:
    k = 0x86;
    goto LAB_00125a1c;
  case 0xffc1:
    k = 0x87;
    goto LAB_00125a1c;
  case 0xffc2:
    k = 0x88;
    goto LAB_00125a1c;
  case 0xffc3:
    k = 0x89;
    goto LAB_00125a1c;
  case 0xffc4:
    k = 0x8a;
    goto LAB_00125a1c;
  case 0xffc5:
    k = 0x8b;
    goto LAB_00125a1c;
  case 0xffc6:
    k = 0x8c;
    goto LAB_00125a1c;
  case 0xffc7:
    k = 0x8d;
    goto LAB_00125a1c;
  case 0xffc8:
    k = 0x8e;
    goto LAB_00125a1c;
  case 0xffc9:
    k = 0x8f;
    goto LAB_00125a1c;
  case 0xffca:
    k = 0x90;
    goto LAB_00125a1c;
  case 0xffcb:
    k = 0x91;
    goto LAB_00125a1c;
  case 0xffcc:
    k = 0x92;
    goto LAB_00125a1c;
  default:
    if (ks == 0xff08) {
      k = 0x9f;
    }
    else if (ks == 0xffff) {
      k = 0x9e;
    }
    else if (ks == 0xff0d) {
      k = 0x9c;
    }
    else if (ks == 0xff13) {
      k = 0x99;
    }
    else if (ks == 0xff1b) {
      k = 0xe000;
    }
    else {
      if (ks != 0xff09) goto switchD_00125760_caseD_ff58;
      k = 0x9d;
    }
    goto LAB_00125a1c;
  }
  bVar13 = bVar13 | 0x10;
LAB_00125a1c:
  bVar13 = (byte)((xev_body.xkey.state & 4) >> 2) | bVar13;
  mods = bVar13 | 2;
  if ((xev_body.xkey.state & 1) == 0) {
    mods = bVar13;
  }
LAB_00125a35:
  Term_keypress(k,mods);
LAB_001257c3:
  Term_activate(t);
  Infowin = (infowin *)t[1].data;
  return 0;
}

Assistant:

static errr CheckEvent(bool wait)
{
	term_data *old_td = (term_data*)(Term->data);

	XEvent xev_body, *xev = &xev_body;

	term_data *td = NULL;
	infowin *iwin = NULL;

	int i;
	int window = 0;

	/* Do not wait unless requested */
	if (!wait && !XPending(Metadpy->dpy)) return (1);

	/* Wait in 0.02s increments while updating animations every 0.2s */
	i = 0;
	while (!XPending(Metadpy->dpy)) {
		if (i == 0) idle_update();
		usleep(20000);
		i = (i + 1) % 10;
	}

	/* Load the Event */
	XNextEvent(Metadpy->dpy, xev);


	/* Notice new keymaps */
	if (xev->type == MappingNotify) {
		XRefreshKeyboardMapping(&xev->xmapping);
		return 0;
	}


	/* Scan the windows */
	for (i = 0; i < MAX_TERM_DATA; i++) {
		if (xev->xany.window == data[i].win->win) {
			td = &data[i];
			iwin = td->win;
			window = i;
			break;
		}
	}

	/* Unknown window */
	if (!td || !iwin) return (0);

	/* Hack -- activate the Term */
	Term_activate(&td->t);

	/* Hack -- activate the window */
	Infowin_set(iwin);

	/* Switch on the Type */
	switch (xev->type)
	{
		case ButtonPress:
		{
			bool press = (xev->type == ButtonPress);

			int z = 0;

			/* Where is the mouse */
			int x = xev->xbutton.x;
			int y = xev->xbutton.y;

			/* Which button is involved */
			if (xev->xbutton.button == Button1) z = 1;
			else if (xev->xbutton.button == Button2) z = 2;
			else if (xev->xbutton.button == Button3) z = 3;
			else if (xev->xbutton.button == Button4) z = 4;
			else if (xev->xbutton.button == Button5) z = 5;
			else z = 0;

			/* Save a byte in ui-term/Term_mousepress for some reason */
			uint32_t state = ((XButtonEvent*) xev)->state;
			if(state & ShiftMask) {
				z |= (KC_MOD_SHIFT << 4);
			}
			if(state & ControlMask) {
				z |= (KC_MOD_CONTROL << 4);
			}
			if(state & Mod1Mask) {
				z |= (KC_MOD_ALT << 4);
			}

			/* The co-ordinates are only used in Angband format. */
			pixel_to_square(&x, &y, x, y);
			if (press) Term_mousepress(x, y, z);

			break;
		}

		case KeyPress:
		{
			/* Hack -- use "old" term */
			Term_activate(&old_td->t);

			/* Process the key */
			react_keypress(&(xev->xkey));

			break;
		}

		case Expose:
		{
			int x1, x2, y1, y2;

			x1 = (xev->xexpose.x - Infowin->ox) / td->tile_wid;
			x2 = (xev->xexpose.x + xev->xexpose.width - Infowin->ox) /
				td->tile_wid;

			y1 = (xev->xexpose.y - Infowin->oy) / td->tile_hgt;
			y2 = (xev->xexpose.y + xev->xexpose.height - Infowin->oy) /
				td->tile_hgt;

			Term_redraw_section(x1, y1, x2, y2);

			break;
		}

		case MapNotify:
		{
			Infowin->mapped = 1;
			Term->mapped_flag = true;
			break;
		}

		case UnmapNotify:
		{
			Infowin->mapped = 0;
			Term->mapped_flag = false;
			break;
		}

		/* Move and/or Resize */
		case ConfigureNotify:
		{
			int cols, rows, wid, hgt, force_resize;

			int ox = Infowin->ox;
			int oy = Infowin->oy;

			/* Save the new Window Parms */
			Infowin->x = xev->xconfigure.x;
			Infowin->y = xev->xconfigure.y;
			Infowin->w = xev->xconfigure.width;
			Infowin->h = xev->xconfigure.height;

			/* Determine "proper" number of rows/cols */
			cols = ((Infowin->w - (ox + ox)) / td->tile_wid);
			rows = ((Infowin->h - (oy + oy)) / td->tile_hgt);

			/* Hack -- minimal size */
			if (cols < 1) cols = 1;
			if (rows < 1) rows = 1;

			if (window == 0) {
				/* Hack the main window must be at least 80x24 */
				force_resize = false;
				if (cols < 80) {
					cols = 80;
					force_resize = true;
				}
				if (rows < 24) {
					rows = 24;
					force_resize = true;
				}

				/* Resize the windows if any "change" is needed */
				if (force_resize) {
					/* Desired size of window */
					wid = cols * td->tile_wid + (ox + ox);
					hgt = rows * td->tile_hgt + (oy + oy);

					/* Resize window */
					Infowin_set(td->win);
					Infowin_resize(wid, hgt);
				}
			}

			/* Resize the Term (if needed) */
			(void)Term_resize(cols, rows);

			break;
		}
	}

	/* Hack -- Activate the old term */
	Term_activate(&old_td->t);

	/* Hack -- Activate the proper window */
	Infowin_set(old_td->win);

	/* Success */
	return (0);
}